

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_ElevationGrid(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  DeadlyImportError *pDVar7;
  size_type sVar8;
  CX3DImporter_NodeElement_ElevationGrid *this_00;
  reference pfVar9;
  float _x;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  byte local_1c9;
  value_type_conflict4 local_1c8;
  int iStack_1c4;
  bool close_found;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int32_t fxi_e;
  int32_t fxi;
  int32_t fzi_e;
  int32_t fzi;
  value_type_conflict4 local_18c;
  ulong local_188;
  size_t i_e;
  size_t i;
  aiVector3D tvec;
  int32_t xi;
  int32_t zi;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_158;
  const_iterator he_it;
  CX3DImporter_NodeElement_ElevationGrid *grid_alias;
  string local_140;
  undefined1 local_11a;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  undefined4 local_d0;
  allocator<char> local_c9;
  undefined1 local_c8 [8];
  string an;
  uint local_94;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  int32_t local_80;
  float zSpacing;
  int32_t zDimension;
  float xSpacing;
  int32_t xDimension;
  bool solid;
  bool normalPerVertex;
  vector<float,_std::allocator<float>_> height;
  float creaseAngle;
  bool colorPerVertex;
  bool ccw;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&creaseAngle);
  height.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  height.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  height.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&xDimension);
  xSpacing._3_1_ = 1;
  xSpacing._2_1_ = 1;
  zDimension = 0;
  zSpacing = 1.0;
  local_80 = 0;
  ne._4_4_ = 1.0;
  _idx_end = (CX3DImporter_NodeElement_ElevationGrid *)0x0;
  local_94 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_94 < iVar2; local_94 = local_94 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_94);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(char *)CONCAT44(extraout_var,iVar3),&local_c9);
    std::allocator<char>::~allocator(&local_c9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_94);
      std::__cxx11::string::operator=
                ((string *)&creaseAngle,(char *)CONCAT44(extraout_var_00,iVar3));
      local_d0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_94);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        local_d0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"bboxCenter");
        if (bVar1) {
          local_d0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c8,"bboxSize");
          if (bVar1) {
            local_d0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,"containerField");
            if (bVar1) {
              local_d0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c8,"solid");
              if (bVar1) {
                xSpacing._2_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_94);
                local_d0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_c8,"ccw");
                if (bVar1) {
                  height.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._7_1_ =
                       XML_ReadNode_GetAttrVal_AsBool(this,local_94);
                  local_d0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_c8,"colorPerVertex");
                  if (bVar1) {
                    height.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._6_1_ =
                         XML_ReadNode_GetAttrVal_AsBool(this,local_94);
                    local_d0 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_c8,"normalPerVertex");
                    if (bVar1) {
                      xSpacing._3_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_94);
                      local_d0 = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_c8,"creaseAngle");
                      if (bVar1) {
                        height.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_ =
                             XML_ReadNode_GetAttrVal_AsFloat(this,local_94);
                        local_d0 = 4;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_c8,"height");
                        if (bVar1) {
                          XML_ReadNode_GetAttrVal_AsArrF
                                    (this,local_94,
                                     (vector<float,_std::allocator<float>_> *)&xDimension);
                          local_d0 = 4;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_c8,"xDimension");
                          if (bVar1) {
                            zDimension = XML_ReadNode_GetAttrVal_AsI32(this,local_94);
                            local_d0 = 4;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_c8,"xSpacing");
                            if (bVar1) {
                              zSpacing = XML_ReadNode_GetAttrVal_AsFloat(this,local_94);
                              local_d0 = 4;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_c8,"zDimension");
                              if (bVar1) {
                                local_80 = XML_ReadNode_GetAttrVal_AsI32(this,local_94);
                                local_d0 = 4;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_c8,"zSpacing");
                                if (bVar1) {
                                  ne._4_4_ = XML_ReadNode_GetAttrVal_AsFloat(this,local_94);
                                  local_d0 = 4;
                                }
                                else {
                                  Throw_IncorrectAttr(this,(string *)local_c8);
                                  local_d0 = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_c8);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_ElevationGrid,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    if (((zSpacing == 0.0) && (!NAN(zSpacing))) || ((ne._4_4_ == 0.0 && (!NAN(ne._4_4_))))) {
      local_f2 = 1;
      pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"Spacing in <ElevationGrid> must be grater than zero.",
                 &local_f1);
      DeadlyImportError::DeadlyImportError(pDVar7,&local_f0);
      local_f2 = 0;
      __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if ((zDimension < 1) || (local_80 < 1)) {
      local_11a = 1;
      pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"Dimension in <ElevationGrid> must be grater than zero.",
                 &local_119);
      DeadlyImportError::DeadlyImportError(pDVar7,&local_118);
      local_11a = 0;
      __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    iVar2 = zDimension * local_80;
    sVar8 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)&xDimension);
    if ((long)iVar2 != sVar8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Heights count must be equal to \"xDimension * zDimension\"",
                 (allocator<char> *)((long)&grid_alias + 7));
      Throw_IncorrectAttrValue(this,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)((long)&grid_alias + 7));
    }
    this_00 = (CX3DImporter_NodeElement_ElevationGrid *)operator_new(0x90);
    CX3DImporter_NodeElement_ElevationGrid::CX3DImporter_NodeElement_ElevationGrid
              (this_00,ENET_ElevationGrid,this->NodeElement_Cur);
    _idx_end = this_00;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID,(string *)&creaseAngle);
    }
    he_it._M_current = (float *)_idx_end;
    _xi = std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)&xDimension);
    __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
    __normal_iterator<float*>
              ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)
               &local_158,
               (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)&xi);
    for (tvec.z = 0.0; (int)tvec.z < local_80; tvec.z = (float)((int)tvec.z + 1)) {
      for (tvec.y = 0.0; (int)tvec.y < zDimension; tvec.y = (float)((int)tvec.y + 1)) {
        _x = zSpacing * (float)(int)tvec.y;
        pfVar9 = __gnu_cxx::
                 __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
                 operator*(&local_158);
        aiVector3t<float>::aiVector3t
                  ((aiVector3t<float> *)((long)&i + 4),_x,*pfVar9,ne._4_4_ * (float)(int)tvec.z);
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   (he_it._M_current + 0x14),(value_type *)((long)&i + 4));
        __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_158);
      }
    }
    if ((zDimension < 2) || (local_80 < 2)) {
      (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).NumIndices = 2;
      i_e = 0;
      sVar8 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         (he_it._M_current + 0x14));
      local_188 = sVar8 - 1;
      for (; i_e < local_188; i_e = i_e + 1) {
        local_18c = (value_type_conflict4)i_e;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_18c);
        fzi = (value_type_conflict4)i_e + 1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&fzi);
        fzi_e = -1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&fzi_e);
      }
    }
    else {
      (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).NumIndices = 4;
      fxi_e = local_80 + -1;
      for (fxi = 0; fxi < fxi_e; fxi = fxi + 1) {
        local_1a4 = zDimension + -1;
        for (local_1a0 = 0; local_1a0 < local_1a4; local_1a0 = local_1a0 + 1) {
          if ((height.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
            local_1b8 = fxi * zDimension + local_1a0;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_1b8);
            local_1bc = local_1a0 + 1 + fxi * zDimension;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_1bc);
            local_1c0 = local_1a0 + 1 + (fxi + 1) * zDimension;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_1c0);
            iStack_1c4 = (fxi + 1) * zDimension + local_1a0;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),
                       &stack0xfffffffffffffe3c);
          }
          else {
            local_1a8 = (fxi + 1) * zDimension + local_1a0;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_1a8);
            local_1ac = local_1a0 + 1 + (fxi + 1) * zDimension;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_1ac);
            local_1b0 = local_1a0 + 1 + fxi * zDimension;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_1b0);
            local_1b4 = fxi * zDimension + local_1a0;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_1b4);
          }
          local_1c8 = -1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)(he_it._M_current + 0x1e),&local_1c8);
        }
      }
    }
    *(byte *)((long)he_it._M_current + 0x72) =
         height.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._6_1_ & 1;
    *(byte *)((long)he_it._M_current + 0x71) = xSpacing._3_1_ & 1;
    he_it._M_current[0x1d] =
         height.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_;
    *(byte *)(he_it._M_current + 0x1c) = xSpacing._2_1_ & 1;
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) == 0) {
      ParseHelper_Node_Enter(this,(CX3DImporter_NodeElement *)_idx_end);
      local_1c9 = 0;
      do {
        do {
          while( true ) {
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])
                              ();
            if ((uVar4 & 1) == 0) goto LAB_00b78c9e;
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])
                              ();
            if (iVar2 != 1) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f0,"Color",&local_1f1);
            bVar1 = XML_CheckNode_NameEqual(this,&local_1f0);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::allocator<char>::~allocator(&local_1f1);
            if (bVar1) {
              ParseNode_Rendering_Color(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_218,"ColorRGBA",&local_219);
              bVar1 = XML_CheckNode_NameEqual(this,&local_218);
              std::__cxx11::string::~string((string *)&local_218);
              std::allocator<char>::~allocator(&local_219);
              if (bVar1) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_240,"Normal",&local_241);
                bVar1 = XML_CheckNode_NameEqual(this,&local_240);
                std::__cxx11::string::~string((string *)&local_240);
                std::allocator<char>::~allocator(&local_241);
                if (bVar1) {
                  ParseNode_Rendering_Normal(this);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_268,"TextureCoordinate",&local_269);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_268);
                  std::__cxx11::string::~string((string *)&local_268);
                  std::allocator<char>::~allocator(&local_269);
                  if (bVar1) {
                    ParseNode_Texturing_TextureCoordinate(this);
                  }
                  else {
                    bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
                    if (!bVar1) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_290,"ElevationGrid",&local_291);
                      XML_CheckNode_SkipUnsupported(this,&local_290);
                      std::__cxx11::string::~string((string *)&local_290);
                      std::allocator<char>::~allocator(&local_291);
                    }
                  }
                }
              }
            }
          }
          pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])()
          ;
        } while (iVar2 != 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"ElevationGrid",&local_2b9);
        bVar1 = XML_CheckNode_NameEqual(this,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator(&local_2b9);
      } while (!bVar1);
      local_1c9 = 1;
LAB_00b78c9e:
      if ((local_1c9 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"ElevationGrid",&local_2e1);
        Throw_CloseNotFound(this,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&xDimension);
  std::__cxx11::string::~string((string *)&creaseAngle);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_ElevationGrid()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    float creaseAngle = 0;
    std::vector<float> height;
    bool normalPerVertex = true;
    bool solid = true;
    int32_t xDimension = 0;
    float xSpacing = 1;
    int32_t zDimension = 0;
    float zSpacing = 1;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("creaseAngle", creaseAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("height", height, XML_ReadNode_GetAttrVal_AsArrF);
		MACRO_ATTRREAD_CHECK_RET("xDimension", xDimension, XML_ReadNode_GetAttrVal_AsI32);
		MACRO_ATTRREAD_CHECK_RET("xSpacing", xSpacing, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("zDimension", zDimension, XML_ReadNode_GetAttrVal_AsI32);
		MACRO_ATTRREAD_CHECK_RET("zSpacing", zSpacing, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_ElevationGrid, ne);
	}
	else
	{
		if((xSpacing == 0.0f) || (zSpacing == 0.0f)) throw DeadlyImportError("Spacing in <ElevationGrid> must be grater than zero.");
		if((xDimension <= 0) || (zDimension <= 0)) throw DeadlyImportError("Dimension in <ElevationGrid> must be grater than zero.");
		if((size_t)(xDimension * zDimension) != height.size()) Throw_IncorrectAttrValue("Heights count must be equal to \"xDimension * zDimension\"");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_ElevationGrid(CX3DImporter_NodeElement::ENET_ElevationGrid, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_ElevationGrid& grid_alias = *((CX3DImporter_NodeElement_ElevationGrid*)ne);// create alias for conveience

		{// create grid vertices list
			std::vector<float>::const_iterator he_it = height.begin();

			for(int32_t zi = 0; zi < zDimension; zi++)// rows
			{
				for(int32_t xi = 0; xi < xDimension; xi++)// columns
				{
					aiVector3D tvec(xSpacing * xi, *he_it, zSpacing * zi);

					grid_alias.Vertices.push_back(tvec);
					++he_it;
				}
			}
		}// END: create grid vertices list
		//
		// create faces list. In "coordIdx" format
		//
		// check if we have quads
		if((xDimension < 2) || (zDimension < 2))// only one element in dimension is set, create line set.
		{
			((CX3DImporter_NodeElement_ElevationGrid*)ne)->NumIndices = 2;// will be holded as line set.
			for(size_t i = 0, i_e = (grid_alias.Vertices.size() - 1); i < i_e; i++)
			{
				grid_alias.CoordIdx.push_back(static_cast<int32_t>(i));
				grid_alias.CoordIdx.push_back(static_cast<int32_t>(i + 1));
				grid_alias.CoordIdx.push_back(-1);
			}
		}
		else// two or more elements in every dimension is set. create quad set.
		{
			((CX3DImporter_NodeElement_ElevationGrid*)ne)->NumIndices = 4;
			for(int32_t fzi = 0, fzi_e = (zDimension - 1); fzi < fzi_e; fzi++)// rows
			{
				for(int32_t fxi = 0, fxi_e = (xDimension - 1); fxi < fxi_e; fxi++)// columns
				{
					// points direction in face.
					if(ccw)
					{
						// CCW:
						//	3 2
						//	0 1
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + fxi);
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back(fzi * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back(fzi * xDimension + fxi);
					}
					else
					{
						// CW:
						//	0 1
						//	3 2
						grid_alias.CoordIdx.push_back(fzi * xDimension + fxi);
						grid_alias.CoordIdx.push_back(fzi * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + (fxi + 1));
						grid_alias.CoordIdx.push_back((fzi + 1) * xDimension + fxi);
					}// if(ccw) else

					grid_alias.CoordIdx.push_back(-1);
				}// for(int32_t fxi = 0, fxi_e = (xDimension - 1); fxi < fxi_e; fxi++)
			}// for(int32_t fzi = 0, fzi_e = (zDimension - 1); fzi < fzi_e; fzi++)
		}// if((xDimension < 2) || (zDimension < 2)) else

		grid_alias.ColorPerVertex = colorPerVertex;
		grid_alias.NormalPerVertex = normalPerVertex;
		grid_alias.CreaseAngle = creaseAngle;
		grid_alias.Solid = solid;
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("ElevationGrid");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("ElevationGrid");

			MACRO_NODECHECK_LOOPEND("ElevationGrid");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}// if(!mReader->isEmptyElement()) else

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}